

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

double __thiscall chrono::utils::ChRunningAverage::Add(ChRunningAverage *this,double val)

{
  int iVar1;
  double *pdVar2;
  size_t sVar3;
  ChRunningAverage *pCVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  iVar1 = this->m_index;
  this->m_index = iVar1 + 1;
  pdVar2 = (this->m_data)._M_data;
  pCVar4 = (ChRunningAverage *)&this->m_index;
  if (this->m_n <= iVar1) {
    pCVar4 = this;
  }
  pdVar2[iVar1 % this->m_n] = val;
  dVar9 = *pdVar2;
  iVar1 = pCVar4->m_n;
  sVar3 = (this->m_data)._M_size;
  if (sVar3 == 1) {
    dVar9 = dVar9 / (double)iVar1;
    dVar7 = 0.0;
    if (iVar1 == 1) goto LAB_009255ce;
    dVar6 = (*pdVar2 - dVar9) * (*pdVar2 - dVar9);
  }
  else {
    lVar5 = 8;
    do {
      dVar9 = dVar9 + *(double *)((long)pdVar2 + lVar5);
      lVar5 = lVar5 + 8;
    } while (sVar3 * 8 - lVar5 != 0);
    dVar9 = dVar9 / (double)iVar1;
    dVar6 = 0.0;
    dVar7 = 0.0;
    if (iVar1 == 1) goto LAB_009255ce;
    if (sVar3 != 0) {
      dVar6 = (pdVar2[sVar3 - 1] - dVar9) * (pdVar2[sVar3 - 1] - dVar9);
      for (; sVar3 != 1; sVar3 = sVar3 - 1) {
        dVar6 = dVar6 + (pdVar2[sVar3 - 2] - dVar9) * (pdVar2[sVar3 - 2] - dVar9);
      }
    }
  }
  auVar8._0_8_ = dVar6 / (double)(iVar1 + -1);
  auVar8._8_8_ = 0;
  if (auVar8._0_8_ < 0.0) {
    dVar7 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar7 = auVar8._0_8_;
  }
LAB_009255ce:
  this->m_std = dVar7;
  return dVar9;
}

Assistant:

double ChRunningAverage::Add(double val) {
    m_data[(m_index++) % m_n] = val;
    int size = std::min(m_index, m_n);
    double mean = m_data.sum() / size;
    m_std = (size == 1) ? 0 : std::sqrt(std::pow(m_data - mean, 2.0).sum() / (size - 1));
    return mean;
}